

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

token * __thiscall
tinyusdz::AttrMetas::get_colorSpace(token *__return_storage_ptr__,AttrMetas *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  key_type *pkVar2;
  bool bVar3;
  mapped_type *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  allocator local_39;
  key_type local_38;
  
  bVar3 = has_colorSpace(this);
  if (bVar3) {
    ::std::__cxx11::string::string((string *)&local_38,"colorSpace",&local_39);
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::at(&this->meta,&local_38);
    ::std::__cxx11::string::_M_dispose();
    paVar1 = &local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = MetaVariable::get_value<tinyusdz::Token>(this_00,(Token *)&local_38);
    paVar4 = &(__return_storage_ptr__->str_).field_2;
    (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)paVar4;
    if (bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == paVar1) {
        paVar4->_M_allocated_capacity =
             CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->str_).field_2 + 8) = local_38.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->str_)._M_dataplus._M_p = local_38._M_dataplus._M_p;
        (__return_storage_ptr__->str_).field_2._M_allocated_capacity =
             CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0])
        ;
      }
      pkVar2 = &local_38;
      (__return_storage_ptr__->str_)._M_string_length = local_38._M_string_length;
      paVar4 = paVar1;
      local_38._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      pkVar2 = &__return_storage_ptr__->str_;
    }
    pkVar2->_M_string_length = 0;
    paVar4->_M_local_buf[0] = '\0';
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    (__return_storage_ptr__->str_)._M_string_length = 0;
    (__return_storage_ptr__->str_).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

value::token AttrMetas::get_colorSpace() const {
  if (!has_colorSpace()) {
    return value::token();
  }

  const MetaVariable &mv = meta.at("colorSpace");
  value::token tok;
  if (mv.get_value<value::token>(&tok)) {
    return tok;
  }

  return value::token();
}